

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlNodePtr xmlNewNode(xmlNsPtr ns,xmlChar *name)

{
  xmlChar *pxVar1;
  xmlRegisterNodeFunc *pp_Var2;
  xmlNodePtr cur;
  xmlChar *name_local;
  xmlNsPtr ns_local;
  
  if (name == (xmlChar *)0x0) {
    ns_local = (xmlNsPtr)0x0;
  }
  else {
    ns_local = (xmlNsPtr)(*xmlMalloc)(0x78);
    if ((xmlNodePtr)ns_local == (xmlNodePtr)0x0) {
      xmlTreeErrMemory("building node");
      ns_local = (xmlNsPtr)0x0;
    }
    else {
      memset(ns_local,0,0x78);
      ((xmlNodePtr)ns_local)->type = XML_ELEMENT_NODE;
      pxVar1 = xmlStrdup(name);
      ((xmlNodePtr)ns_local)->name = pxVar1;
      ((xmlNodePtr)ns_local)->ns = ns;
      if ((__xmlRegisterCallbacks != 0) &&
         (pp_Var2 = __xmlRegisterNodeDefaultValue(), *pp_Var2 != (xmlRegisterNodeFunc)0x0)) {
        pp_Var2 = __xmlRegisterNodeDefaultValue();
        (**pp_Var2)((xmlNodePtr)ns_local);
      }
    }
  }
  return (xmlNodePtr)ns_local;
}

Assistant:

xmlNodePtr
xmlNewNode(xmlNsPtr ns, const xmlChar *name) {
    xmlNodePtr cur;

    if (name == NULL) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlNewNode : name == NULL\n");
#endif
	return(NULL);
    }

    /*
     * Allocate a new node and fill the fields.
     */
    cur = (xmlNodePtr) xmlMalloc(sizeof(xmlNode));
    if (cur == NULL) {
	xmlTreeErrMemory("building node");
	return(NULL);
    }
    memset(cur, 0, sizeof(xmlNode));
    cur->type = XML_ELEMENT_NODE;

    cur->name = xmlStrdup(name);
    cur->ns = ns;

    if ((__xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue))
	xmlRegisterNodeDefaultValue(cur);
    return(cur);
}